

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

void __thiscall
ConvexDecomposition::HullLibrary::BringOutYourDead
          (HullLibrary *this,float *verts,uint vcount,float *overts,uint *ocount,uint *indices,
          uint indexcount)

{
  uint uVar1;
  int iVar2;
  void *__s;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  
  __s = malloc((ulong)vcount << 2);
  memset(__s,0,(ulong)vcount << 2);
  *ocount = 0;
  if (indexcount != 0) {
    lVar3 = 0;
    do {
      uVar1 = indices[lVar3];
      uVar4 = (ulong)uVar1;
      if (vcount <= uVar1) {
        __assert_fail("v >= 0 && v < vcount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                      ,0xc9f,
                      "void ConvexDecomposition::HullLibrary::BringOutYourDead(const float *, unsigned int, float *, unsigned int &, unsigned int *, unsigned int)"
                     );
      }
      iVar2 = *(int *)((long)__s + uVar4 * 4);
      if (iVar2 == 0) {
        indices[lVar3] = *ocount;
        uVar5 = *ocount;
        overts[uVar5 * 3] = verts[uVar1 * 3];
        overts[uVar5 * 3 + 1] = verts[uVar4 * 3 + 1 & 0xffffffff];
        overts[uVar5 * 3 + 2] = verts[uVar4 * 3 + 2 & 0xffffffff];
        uVar5 = uVar5 + 1;
        *ocount = uVar5;
        if (vcount < uVar5) {
          __assert_fail("ocount >=0 && ocount <= vcount",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                        ,0xcb0,
                        "void ConvexDecomposition::HullLibrary::BringOutYourDead(const float *, unsigned int, float *, unsigned int &, unsigned int *, unsigned int)"
                       );
        }
        *(uint *)((long)__s + uVar4 * 4) = uVar5;
      }
      else {
        indices[lVar3] = iVar2 - 1;
      }
      lVar3 = lVar3 + 1;
    } while (indexcount != (uint)lVar3);
  }
  free(__s);
  return;
}

Assistant:

void HullLibrary::BringOutYourDead(const float *verts,unsigned int vcount, float *overts,unsigned int &ocount,unsigned int *indices,unsigned indexcount)
{
	unsigned int *used = (unsigned int *)malloc(sizeof(unsigned int)*vcount);
	memset(used,0,sizeof(unsigned int)*vcount);

	ocount = 0;

	for (unsigned int i=0; i<indexcount; i++)
	{
		unsigned int v = indices[i]; // original array index

		assert( v >= 0 && v < vcount );

		if ( used[v] ) // if already remapped
		{
			indices[i] = used[v]-1; // index to new array
		}
		else
		{

			indices[i] = ocount;      // new index mapping

			overts[ocount*3+0] = verts[v*3+0]; // copy old vert to new vert array
			overts[ocount*3+1] = verts[v*3+1];
			overts[ocount*3+2] = verts[v*3+2];

			ocount++; // increment output vert count

			assert( ocount >=0 && ocount <= vcount );

			used[v] = ocount; // assign new index remapping
		}
	}

	free(used);
}